

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

_Bool string_no_case_compare(char *one,char *two)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  bool bVar5;
  char local_22;
  char ch_two;
  char *pcStack_20;
  char ch_one;
  char *two_local;
  char *one_local;
  
  if ((one != (char *)0x0) && (two != (char *)0x0)) {
    sVar3 = strlen(one);
    sVar4 = strlen(two);
    if (sVar3 == sVar4) {
      local_22 = '\0';
      pcStack_20 = two;
      two_local = one;
      while( true ) {
        bVar5 = false;
        if (*two_local != '\0') {
          local_22 = *pcStack_20;
          bVar5 = local_22 != '\0';
        }
        if (!bVar5) break;
        iVar1 = tolower((int)*two_local);
        iVar2 = tolower((int)local_22);
        if (iVar1 != iVar2) {
          return false;
        }
        two_local = two_local + 1;
        pcStack_20 = pcStack_20 + 1;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool string_no_case_compare(const char *one, const char *two)
{
        if (one == NULL || two == NULL || (strlen(one) != strlen(two))) {
                return false;
        }

        char ch_one = '\0';
        char ch_two = '\0';

        while ((ch_one = *one) != '\0' && (ch_two = *two) != '\0') {
                if (tolower(ch_one) != tolower(ch_two)) {
                        return false;
                }

                ++one;
                ++two;
        }

        return true;
}